

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void __thiscall
Reset_printResetWithoutTestValue_Test::~Reset_printResetWithoutTestValue_Test
          (Reset_printResetWithoutTestValue_Test *this)

{
  Reset_printResetWithoutTestValue_Test *this_local;
  
  ~Reset_printResetWithoutTestValue_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, printResetWithoutTestValue)
{
    std::string a;
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model\">\n"
        "  <component name=\"component\">\n"
        "    <variable name=\"variable1\"/>\n"
        "    <variable name=\"variable2\"/>\n"
        "    <reset variable=\"variable1\" test_variable=\"variable2\" order=\"1\">\n"
        "      <reset_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\"/>\n"
        "      </reset_value>\n"
        "    </reset>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::ResetPtr r1 = libcellml::Reset::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();

    m->setName("model");
    c->setName("component");
    v1->setName("variable1");
    v2->setName("variable2");

    r1->setVariable(v1);
    r1->setTestVariable(v2);
    r1->setOrder(1);
    r1->setResetValue(EMPTY_MATH);

    c->addReset(r1);
    c->addVariable(v1);
    c->addVariable(v2);

    libcellml::PrinterPtr p = libcellml::Printer::create();
    a = p->printModel(m);
    EXPECT_EQ(e, a);
}